

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StringGetcMethod::~StringGetcMethod(StringGetcMethod *this)

{
  StringGetcMethod *this_local;
  
  ~StringGetcMethod(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit StringGetcMethod(Compilation& comp) :
        SimpleSystemSubroutine("getc", SubroutineKind::Function, 1, {&comp.getIntType()},
                               comp.getByteType(), true) {}